

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurseSolution.cpp
# Opt level: O1

bool __thiscall NurseSolution::addTurn(NurseSolution *this,Turn *turn)

{
  pointer *pppTVar1;
  Turn **ppTVar2;
  iterator __position;
  __normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_> _Var3;
  Turn *local_28;
  Turn *local_20;
  
  local_28 = turn;
  local_20 = turn;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<Turn**,std::vector<Turn*,std::allocator<Turn*>>>,__gnu_cxx::__ops::_Iter_equals_val<Turn_const*const>>
                    ((this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  ppTVar2 = (this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (_Var3._M_current == ppTVar2) {
    __position._M_current =
         (this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Turn*,std::allocator<Turn*>>::_M_realloc_insert<Turn*const&>
                ((vector<Turn*,std::allocator<Turn*>> *)&this->turns,__position,&local_28);
    }
    else {
      *__position._M_current = local_28;
      pppTVar1 = &(this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
  }
  return _Var3._M_current == ppTVar2;
}

Assistant:

bool NurseSolution::addTurn(Turn* turn){
    if(!hasTurn(turn))
    {
        turns.push_back(turn);
        return true;
    }
    return false;
}